

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

bool check_user_password_V5(string *user_password,EncryptionData *data)

{
  __type_conflict1 _Var1;
  string *psVar2;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  undefined1 local_88 [8];
  string password;
  undefined1 local_58 [8];
  string validation_salt;
  string user_data;
  EncryptionData *data_local;
  string *user_password_local;
  
  psVar2 = QPDF::EncryptionData::getU_abi_cxx11_(data);
  std::__cxx11::string::substr((ulong)((long)&validation_salt.field_2 + 8),(ulong)psVar2);
  psVar2 = QPDF::EncryptionData::getU_abi_cxx11_(data);
  std::__cxx11::string::substr((ulong)local_58,(ulong)psVar2);
  truncate_password_V5((string *)local_88,user_password);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
  hash_V5(&local_a8,(string *)local_88,(string *)local_58,&local_c8,data);
  _Var1 = std::operator==(&local_a8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&validation_salt.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(validation_salt.field_2._M_local_buf + 8));
  return _Var1;
}

Assistant:

static bool
check_user_password_V5(std::string const& user_password, QPDF::EncryptionData const& data)
{
    // Algorithm 3.11 from the PDF 1.7 extension level 3

    std::string user_data = data.getU().substr(0, 32);
    std::string validation_salt = data.getU().substr(32, 8);
    std::string password = truncate_password_V5(user_password);
    return (hash_V5(password, validation_salt, "", data) == user_data);
}